

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)1>
          (LogMessage *this,char ch,size_t num)

{
  LogMessageData *pLVar1;
  ulong uVar2;
  size_type *psVar3;
  LogMessageData *this_00;
  Span<char> SVar4;
  Span<char> msg;
  Span<char> encoded_remaining_copy;
  Span<char> local_48;
  pointer local_38;
  
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(pLVar1);
  }
  local_48.ptr_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_;
  local_48.len_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
  SVar4 = EncodeMessageStart(7,num + 0xb,&local_48);
  local_38 = SVar4.ptr_;
  msg = EncodeMessageStart(1,num,&local_48);
  if (msg.ptr_ == (pointer)0x0) {
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    this_00 = pLVar1;
    if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
      (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar1);
      this_00 = (this->data_)._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                ._M_head_impl;
      if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
        (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ =
             (this_00->encoded_buf)._M_elems;
        (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
        LogMessageData::InitializeEncodingAndFormat(this_00);
      }
    }
    uVar2 = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
    psVar3 = &(this_00->encoded_remaining_actual_do_not_use_directly).len_;
    if (uVar2 < *psVar3) {
      __assert_fail("false && \"size() >= n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/types/span.h"
                    ,0x1b5,
                    "auto absl::Span<char>::remove_suffix(size_type)::(anonymous class)::operator()() const [T = char]"
                   );
    }
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = uVar2 - *psVar3;
  }
  else {
    if (local_48.len_ < num) {
      num = local_48.len_;
    }
    memset(local_48.ptr_,(uint)(byte)ch,num);
    if (local_48.len_ < num) {
      __assert_fail("false && \"size() >= n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/types/span.h"
                    ,0x1ac,
                    "auto absl::Span<char>::remove_prefix(size_type)::(anonymous class)::operator()() const [T = char]"
                   );
    }
    local_48.ptr_ = local_48.ptr_ + num;
    local_48.len_ = local_48.len_ - num;
    EncodeMessageLength(msg,&local_48);
    SVar4.len_ = SVar4.len_;
    SVar4.ptr_ = local_38;
    EncodeMessageLength(SVar4,&local_48);
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
      (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar1);
    }
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = local_48.ptr_;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = local_48.len_;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(char ch, size_t num) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto value_start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + num,
      &encoded_remaining_copy);
  auto str_start = EncodeMessageStart(tag_value, num, &encoded_remaining_copy);
  if (str_start.data()) {
    // The field headers fit.
    log_internal::AppendTruncated(ch, num, encoded_remaining_copy);
    EncodeMessageLength(str_start, &encoded_remaining_copy);
    EncodeMessageLength(value_start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}